

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV4MeshLong(Parser *this,uint *iOut)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = SkipSpaces<char>(&this->filePtr);
  if (bVar1) {
    uVar2 = strtoul10(this->filePtr,&this->filePtr);
    *iOut = uVar2;
  }
  else {
    LogWarning(this,"Unable to parse long: unexpected EOL [#1]");
    *iOut = 0;
    this->iLineNumber = this->iLineNumber + 1;
  }
  return;
}

Assistant:

void Parser::ParseLV4MeshLong(unsigned int& iOut)
{
    // Skip spaces and tabs
    if(!SkipSpaces(&filePtr))
    {
        // LOG
        LogWarning("Unable to parse long: unexpected EOL [#1]");
        iOut = 0;
        ++iLineNumber;
        return;
    }
    // parse the value
    iOut = strtoul10(filePtr,&filePtr);
}